

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall HashtableTest_StringIO_Test::TestBody(HashtableTest_StringIO_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  pointer psVar2;
  undefined8 *puVar3;
  AssertHelper __size;
  value_type *pvVar4;
  FILE *pFVar5;
  undefined8 uVar6;
  void *pvVar7;
  pointer psVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  pointer ppVar12;
  SetKey *pSVar13;
  FILE *__stream;
  internal iVar14;
  float fVar15;
  size_type first_size_1;
  size_type second_size_1;
  size_type first_size;
  size_type second_size;
  sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ht_in;
  sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ht_out;
  AssertHelper local_228;
  undefined8 *local_220;
  AssertHelper local_218;
  AssertHelper local_210;
  undefined1 local_208 [32];
  pointer local_1e8;
  iterator iStack_1e0;
  iterator local_1d8;
  iterator iStack_1d0;
  nonempty_iterator local_1c8;
  undefined1 local_1b8 [32];
  pointer local_198;
  iterator local_190;
  iterator local_188;
  iterator local_180;
  nonempty_iterator local_178;
  AssertHelper local_170;
  void *local_168;
  FILE *local_160;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined8 local_138;
  const_iterator cStack_130;
  const_iterator local_128;
  const_iterator cStack_120;
  _Alloc_hider local_118;
  undefined1 local_108 [24];
  sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  ulong local_c8;
  undefined1 local_c0 [64];
  _Alloc_hider local_80;
  char local_70 [24];
  sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = local_158._8_8_ & 0xffffffff00000000;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = local_208._8_8_ & 0xffffffff00000000;
  pSVar13 = (SetKey *)&local_228;
  google::
  sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::sparse_hashtable((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_c0,0,(Hasher *)local_158,(Hasher *)local_208,(SelectKey *)local_1b8,
                     pSVar13,(libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_218);
  local_158._0_8_ = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"");
  google::
  sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_c0);
  local_c0[0x2a] = true;
  std::__cxx11::string::_M_assign((string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ != &local_148) {
    operator_delete((void *)local_158._0_8_);
  }
  lVar10 = 0x20;
  do {
    local_158._0_8_ = &local_148;
    std::__cxx11::string::_M_construct((ulong)local_158,(char)lVar10);
    local_208._0_8_ = local_208 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_208,'\x01');
    pvVar4 = google::
             sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::
             find_or_insert<google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::DefaultValue>
                       ((sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)local_c0,(key_type *)local_208);
    std::__cxx11::string::operator=((string *)&pvVar4->second,(string *)local_158);
    if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
      operator_delete((void *)local_208._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ != &local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x80);
  local_158._0_8_ = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"c","");
  google::
  sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_c0,(key_type *)local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ != &local_148) {
    operator_delete((void *)local_158._0_8_);
  }
  local_158._0_8_ = &local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"y","");
  google::
  sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_c0,(key_type *)local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._0_8_ != &local_148) {
    operator_delete((void *)local_158._0_8_);
  }
  pFVar5 = tmpfile();
  iVar14 = (internal)(pFVar5 != (FILE *)0x0);
  local_208._8_8_ =
       (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x0;
  local_208[0] = iVar14;
  if (!(bool)iVar14) {
    testing::Message::Message((Message *)local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_208,(AssertionResult *)"fp != __null","false",
               "true",(char *)pSVar13);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x47e,(char *)local_158._0_8_);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ != &local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._0_8_ + 8))();
    }
    uVar6 = local_208._8_8_;
    if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_208._8_8_ !=
        (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x0) {
      if (*(pointer *)local_208._8_8_ != (pointer)(local_208._8_8_ + 0x10)) {
        operator_delete(*(pointer *)local_208._8_8_);
      }
      operator_delete((void *)uVar6);
    }
  }
  google::
  sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::squash_deleted((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_c0);
  local_208[0] = (internal)
                 google::
                 sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::write_metadata<_IO_FILE>(&local_58,(_IO_FILE *)pFVar5);
  local_208._8_8_ = (pointer)0x0;
  if (!(bool)local_208[0]) {
    testing::Message::Message((Message *)local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_158,(internal *)local_208,
               (AssertionResult *)"ht_out.write_metadata(fp)","false","true",(char *)pSVar13);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x47f,(char *)local_158._0_8_);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ != &local_148) {
      operator_delete((void *)local_158._0_8_);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b8._0_8_ + 8))();
    }
    uVar6 = local_208._8_8_;
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      if (*(pointer *)local_208._8_8_ != (pointer)(local_208._8_8_ + 0x10)) {
        operator_delete(*(pointer *)local_208._8_8_);
      }
      operator_delete((void *)uVar6);
    }
  }
  local_168 = (void *)CONCAT71(local_168._1_7_,iVar14);
  local_160 = pFVar5;
  google::
  sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin((iterator *)local_208,
          (sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_c0);
  pFVar5 = local_160;
  local_158._0_8_ = local_208._0_8_;
  local_158._8_8_ = local_208._8_8_;
  local_148._M_allocated_capacity = local_208._16_8_;
  local_148._8_8_ = local_208._24_8_;
  local_138 = local_1e8;
  cStack_130._M_current = iStack_1e0._M_current;
  local_128._M_current = local_1d8._M_current;
  cStack_120._M_current = iStack_1d0._M_current;
  local_118._M_p = (pointer)local_1c8;
  do {
    local_208._8_8_ =
         local_58.groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_208._16_8_ =
         local_58.groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_208._24_8_ =
         local_58.groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1e8 = (pointer)0x0;
    iStack_1e0._M_current =
         local_58.groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1d8._M_current =
         local_58.groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    iStack_1d0._M_current =
         local_58.groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8 = (nonempty_iterator)0x0;
    local_208._0_8_ =
         (sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_c0;
    google::
    sparse_hashtable_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_208);
    __stream = local_160;
    if ((((local_158._8_8_ == local_208._8_8_) &&
         (local_148._M_allocated_capacity == local_208._16_8_)) &&
        (local_148._8_8_ == local_208._24_8_)) &&
       ((local_208._24_8_ == local_208._16_8_ || (local_138 == local_1e8)))) {
      rewind(local_160);
      local_208._0_8_ = (char *)0x0;
      local_208._8_8_ = local_208._8_8_ & 0xffffffff00000000;
      local_1b8._0_8_ =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      local_1b8._8_8_ = (ulong)(uint)local_1b8._12_4_ << 0x20;
      pSVar13 = (SetKey *)&local_218;
      google::
      sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::sparse_hashtable((sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_158,0,(Hasher *)local_208,(Hasher *)local_1b8,
                         (SelectKey *)&local_228,pSVar13,
                         (libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_210);
      local_1b8[0] = local_168._0_1_;
      local_1b8._8_8_ =
           (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x0;
      if (__stream == (FILE *)0x0) {
        testing::Message::Message((Message *)&local_228);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_208,(internal *)local_1b8,(AssertionResult *)"fp != __null",
                   "false","true",(char *)pSVar13);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x48e,(char *)local_208._0_8_);
        testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
          operator_delete((void *)local_208._0_8_);
        }
        if ((long *)CONCAT71(local_228.data_._1_7_,local_228.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_228.data_._1_7_,local_228.data_._0_1_) + 8))();
        }
        uVar6 = local_1b8._8_8_;
        if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1b8._8_8_ !=
            (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          if (*(pointer *)local_1b8._8_8_ != (pointer)(local_1b8._8_8_ + 0x10)) {
            operator_delete(*(pointer *)local_1b8._8_8_);
          }
          operator_delete((void *)uVar6);
        }
      }
      local_108._16_8_ = 0;
      local_1b8[0] = (SelectKey)
                     google::
                     sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::read_metadata<_IO_FILE>
                               ((sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)(local_108 + 0x18),(_IO_FILE *)__stream);
      fVar15 = (float)local_138 * (float)local_f0.settings.table_size;
      uVar9 = (ulong)fVar15;
      local_148._M_allocated_capacity = (long)(fVar15 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
      fVar15 = (float)local_f0.settings.table_size * local_138._4_4_;
      uVar9 = (ulong)fVar15;
      local_148._8_8_ = (long)(fVar15 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
      cStack_130._M_current = cStack_130._M_current & 0xffffffffffffff00;
      local_1b8._8_8_ =
           (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x0;
      if (!(bool)local_1b8[0]) {
        testing::Message::Message((Message *)&local_228);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_208,(internal *)local_1b8,
                   (AssertionResult *)"ht_in.read_metadata(fp)","false","true",(char *)pSVar13);
        testing::internal::AssertHelper::AssertHelper
                  (&local_218,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x48f,(char *)local_208._0_8_);
        testing::internal::AssertHelper::operator=(&local_218,(Message *)&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_218);
        if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
          operator_delete((void *)local_208._0_8_);
        }
        if ((long *)CONCAT71(local_228.data_._1_7_,local_228.data_._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_228.data_._1_7_,local_228.data_._0_1_) + 8))();
        }
        uVar6 = local_1b8._8_8_;
        if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1b8._8_8_ !=
            (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          if (*(pointer *)local_1b8._8_8_ != (pointer)(local_1b8._8_8_ + 0x10)) {
            operator_delete(*(pointer *)local_1b8._8_8_);
          }
          operator_delete((void *)uVar6);
        }
      }
      google::
      sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::begin((iterator *)local_208,
              (sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_158);
      do {
        local_1b8._0_8_ = local_158;
        local_1b8._8_8_ =
             local_f0.groups.
             super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1b8._16_8_ =
             local_f0.groups.
             super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1b8._24_8_ =
             local_f0.groups.
             super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_198 = (pointer)0x0;
        local_190._M_current =
             local_f0.groups.
             super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_188._M_current =
             local_f0.groups.
             super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_180._M_current =
             local_f0.groups.
             super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_178 = (nonempty_iterator)0x0;
        google::
        sparse_hashtable_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::advance_past_deleted
                  ((sparse_hashtable_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_1b8);
        if (((local_208._8_8_ == local_1b8._8_8_) && (local_208._16_8_ == local_1b8._16_8_)) &&
           ((local_208._24_8_ == local_1b8._24_8_ &&
            ((local_208._24_8_ == local_208._16_8_ || (local_1e8 == local_198)))))) {
          fclose(__stream);
          local_208._0_8_ = local_208 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_208,"                                ","");
          _Var1._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_1b8 + 0x10);
          local_1b8._0_8_ = _Var1._M_head_impl;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8," ","");
          pvVar4 = google::
                   sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::
                   find_or_insert<google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::DefaultValue>
                             ((sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)local_158,(key_type *)local_1b8);
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)&local_228,"string(\"                                \")",
                     "ht_in[\" \"]",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &pvVar4->second);
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_1b8._0_8_ != _Var1._M_head_impl) {
            operator_delete((void *)local_1b8._0_8_);
          }
          if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
            operator_delete((void *)local_208._0_8_);
          }
          if (local_228.data_._0_1_ == (SetKey)0x0) {
            testing::Message::Message((Message *)local_208);
            if (local_220 == (undefined8 *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = (char *)*local_220;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_1b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                       ,0x4a6,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_1b8,(Message *)local_208);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
            if ((long *)local_208._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_208._0_8_ + 8))();
            }
          }
          puVar3 = local_220;
          if (local_220 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_220 != local_220 + 2) {
              operator_delete((undefined8 *)*local_220);
            }
            operator_delete(puVar3);
          }
          local_208._0_8_ = local_208 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_208,"+++++++++++++++++++++++++++++++++++++++++++","");
          local_1b8._0_8_ = _Var1._M_head_impl;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"+","");
          pvVar4 = google::
                   sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::
                   find_or_insert<google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::DefaultValue>
                             ((sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)local_158,(key_type *)local_1b8);
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)&local_228,
                     "string(\"+++++++++++++++++++++++++++++++++++++++++++\")","ht_in[\"+\"]",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &pvVar4->second);
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_1b8._0_8_ != _Var1._M_head_impl) {
            operator_delete((void *)local_1b8._0_8_);
          }
          if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
            operator_delete((void *)local_208._0_8_);
          }
          if (local_228.data_._0_1_ == (SetKey)0x0) {
            testing::Message::Message((Message *)local_208);
            if (local_220 == (undefined8 *)0x0) {
              pcVar11 = "";
            }
            else {
              pcVar11 = (char *)*local_220;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_1b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                       ,0x4a7,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_1b8,(Message *)local_208);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
            if ((long *)local_208._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_208._0_8_ + 8))();
            }
          }
          puVar3 = local_220;
          if (local_220 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_220 != local_220 + 2) {
              operator_delete((undefined8 *)*local_220);
            }
            operator_delete(puVar3);
          }
          local_208._0_8_ = local_208 + 0x10;
          pcVar11 = "";
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"","");
          local_1b8._0_8_ = _Var1._M_head_impl;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"c","");
          pvVar4 = google::
                   sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::
                   find_or_insert<google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::DefaultValue>
                             ((sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)local_158,(key_type *)local_1b8);
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)&local_228,"string(\"\")","ht_in[\"c\"]",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &pvVar4->second);
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_1b8._0_8_ != _Var1._M_head_impl) {
            operator_delete((void *)local_1b8._0_8_);
          }
          if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
            operator_delete((void *)local_208._0_8_);
          }
          if (local_228.data_._0_1_ == (SetKey)0x0) {
            testing::Message::Message((Message *)local_208);
            if (local_220 != (undefined8 *)0x0) {
              pcVar11 = (char *)*local_220;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_1b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                       ,0x4a8,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_1b8,(Message *)local_208);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
            if ((long *)local_208._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_208._0_8_ + 8))();
            }
          }
          puVar3 = local_220;
          if (local_220 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_220 != local_220 + 2) {
              operator_delete((undefined8 *)*local_220);
            }
            operator_delete(puVar3);
          }
          local_208._0_8_ = local_208 + 0x10;
          pcVar11 = "";
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"","");
          local_1b8._0_8_ = _Var1._M_head_impl;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"y","");
          pvVar4 = google::
                   sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::
                   find_or_insert<google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::DefaultValue>
                             ((sparse_hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,std::__cxx11::string,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)local_158,(key_type *)local_1b8);
          testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                    ((internal *)&local_228,"string(\"\")","ht_in[\"y\"]",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &pvVar4->second);
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_1b8._0_8_ != _Var1._M_head_impl) {
            operator_delete((void *)local_1b8._0_8_);
          }
          if ((undefined1 *)local_208._0_8_ != local_208 + 0x10) {
            operator_delete((void *)local_208._0_8_);
          }
          if (local_228.data_._0_1_ == (SetKey)0x0) {
            testing::Message::Message((Message *)local_208);
            if (local_220 != (undefined8 *)0x0) {
              pcVar11 = (char *)*local_220;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_1b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                       ,0x4a9,pcVar11);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_1b8,(Message *)local_208);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
            if ((long *)local_208._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_208._0_8_ + 8))();
            }
          }
          if (local_220 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_220 != local_220 + 2) {
              operator_delete((undefined8 *)*local_220);
            }
            operator_delete(local_220);
          }
          std::
          vector<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~vector((vector<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)(local_108 + 0x18));
          if ((nonempty_iterator)local_118._M_p != (nonempty_iterator)local_108) {
            operator_delete(local_118._M_p);
          }
          std::
          vector<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~vector(&local_58.groups);
          if (local_80._M_p != local_70) {
            operator_delete(local_80._M_p);
          }
          return;
        }
        local_210.data_._0_4_ = 1;
        local_218.data_ = (AssertHelperData *)fread(&local_228,8,1,__stream);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_1b8,"1u","fread(&first_size, sizeof(first_size), 1, fp)",
                   (uint *)&local_210,(unsigned_long *)&local_218);
        if (local_1b8[0] == (SelectKey)0x0) {
          testing::Message::Message((Message *)&local_218);
          ppVar12 = (pointer)0xaf1463;
          if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1b8._8_8_ !=
              (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0) {
            ppVar12 = *(pointer *)local_1b8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_210,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                     ,0x494,(char *)ppVar12);
          testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
          testing::internal::AssertHelper::~AssertHelper(&local_210);
          if (local_218.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_218.data_ + 8))();
          }
        }
        uVar6 = local_1b8._8_8_;
        if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1b8._8_8_ !=
            (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          if (*(pointer *)local_1b8._8_8_ != (pointer)(local_1b8._8_8_ + 0x10)) {
            operator_delete(*(pointer *)local_1b8._8_8_);
          }
          operator_delete((void *)uVar6);
        }
        uVar9 = CONCAT71(local_228.data_._1_7_,local_228.data_._0_1_);
        pvVar7 = operator_new__(uVar9);
        local_210.data_._0_4_ = 1;
        local_c8 = uVar9;
        local_218.data_ = (AssertHelperData *)fread(pvVar7,uVar9,1,__stream);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_1b8,"1u","fread(first, first_size, 1, fp)",(uint *)&local_210,
                   (unsigned_long *)&local_218);
        if (local_1b8[0] == (SelectKey)0x0) {
          testing::Message::Message((Message *)&local_218);
          ppVar12 = (pointer)0xaf1463;
          if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1b8._8_8_ !=
              (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0) {
            ppVar12 = *(pointer *)local_1b8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_210,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                     ,0x496,(char *)ppVar12);
          testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
          testing::internal::AssertHelper::~AssertHelper(&local_210);
          if (local_218.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_218.data_ + 8))();
          }
        }
        uVar6 = local_1b8._8_8_;
        local_168 = pvVar7;
        if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1b8._8_8_ !=
            (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          if (*(pointer *)local_1b8._8_8_ != (pointer)(local_1b8._8_8_ + 0x10)) {
            operator_delete(*(pointer *)local_1b8._8_8_);
          }
          operator_delete((void *)uVar6);
        }
        local_170.data_._0_4_ = 1;
        local_210.data_ = (AssertHelperData *)fread(&local_218,8,1,__stream);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_1b8,"1u","fread(&second_size, sizeof(second_size), 1, fp)",
                   (uint *)&local_170,(unsigned_long *)&local_210);
        if (local_1b8[0] == (SelectKey)0x0) {
          testing::Message::Message((Message *)&local_210);
          ppVar12 = (pointer)0xaf1463;
          if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1b8._8_8_ !=
              (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0) {
            ppVar12 = *(pointer *)local_1b8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                     ,0x499,(char *)ppVar12);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_210.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_210.data_ + 8))();
          }
        }
        uVar6 = local_1b8._8_8_;
        if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1b8._8_8_ !=
            (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          if (*(pointer *)local_1b8._8_8_ != (pointer)(local_1b8._8_8_ + 0x10)) {
            operator_delete(*(pointer *)local_1b8._8_8_);
          }
          operator_delete((void *)uVar6);
        }
        __size.data_ = local_218.data_;
        pvVar7 = operator_new__((ulong)local_218.data_);
        local_170.data_._0_4_ = 1;
        local_210.data_ = (AssertHelperData *)fread(pvVar7,__size.data_,1,__stream);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)local_1b8,"1u","fread(second, second_size, 1, fp)",(uint *)&local_170
                   ,(unsigned_long *)&local_210);
        if (local_1b8[0] == (SelectKey)0x0) {
          testing::Message::Message((Message *)&local_210);
          ppVar12 = (pointer)0xaf1463;
          if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1b8._8_8_ !=
              (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x0) {
            ppVar12 = *(pointer *)local_1b8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                     ,0x49b,(char *)ppVar12);
          testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          if (local_210.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_210.data_ + 8))();
          }
        }
        uVar6 = local_1b8._8_8_;
        if ((sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1b8._8_8_ !=
            (sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          if (*(pointer *)local_1b8._8_8_ != (pointer)(local_1b8._8_8_ + 0x10)) {
            operator_delete(*(pointer *)local_1b8._8_8_);
          }
          operator_delete((void *)uVar6);
        }
        (local_1e8->first)._M_dataplus._M_p = (pointer)&(local_1e8->first).field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,local_168,(long)local_168 + local_c8);
        (local_1e8->second)._M_dataplus._M_p = (pointer)&(local_1e8->second).field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8->second,pvVar7,(long)pvVar7 + (long)__size.data_);
        operator_delete__(local_168);
        operator_delete__(pvVar7);
        __stream = local_160;
        local_1e8 = local_1e8 + 1;
        psVar8 = (pointer)local_208._24_8_;
        if (local_1e8 ==
            (pointer)((ulong)((Settings *)(local_208._24_8_ + 8))->num_buckets * 0x40 +
                     *(long *)local_208._24_8_)) {
          do {
            psVar8 = (pointer)(local_208._24_8_ + 0x10);
            if (psVar8 == (pointer)local_208._16_8_) break;
            local_1e8 = psVar8->group;
            psVar2 = (pointer)(local_208._24_8_ + 0x10);
            local_208._24_8_ = psVar8;
          } while ((psVar2->settings).num_buckets == 0);
        }
        local_208._24_8_ = psVar8;
        google::
        sparse_hashtable_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::advance_past_deleted
                  ((sparse_hashtable_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_208);
      } while( true );
    }
    local_208._0_8_ = (local_138->first)._M_string_length;
    fwrite((sparse_hashtable_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_208,8,1,pFVar5);
    fwrite((local_138->first)._M_dataplus._M_p,local_208._0_8_,1,pFVar5);
    local_1b8._0_8_ = (local_138->second)._M_string_length;
    fwrite(local_1b8,8,1,pFVar5);
    fwrite((local_138->second)._M_dataplus._M_p,local_1b8._0_8_,1,pFVar5);
    local_138 = local_138 + 1;
    uVar6 = local_148._8_8_;
    if (local_138 ==
        (pointer)((ulong)((Settings *)(local_148._8_8_ + 8))->num_buckets * 0x40 +
                 *(long *)local_148._8_8_)) {
      do {
        uVar6 = local_148._8_8_ + 0x10;
        if (uVar6 == local_148._M_allocated_capacity) break;
        local_138 = ((pointer)uVar6)->group;
        psVar8 = (pointer)(local_148._8_8_ + 0x10);
        local_148._8_8_ = uVar6;
      } while ((psVar8->settings).num_buckets == 0);
    }
    local_148._8_8_ = uVar6;
    google::
    sparse_hashtable_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_158);
  } while( true );
}

Assistant:

TEST(HashtableTest, StringIO) {
  // Since the set case is just a special (easier) case than the map case,
  // I just test on sparse_hash_map.  This handles the difficult case where
  // we have to write our own custom reader/writer for the data.
  sparse_hash_map<string, string, Hasher, Hasher> ht_out;
  ht_out.set_deleted_key(string(""));
  for (int i = 32; i < 128; i++) {
    // This maps 'a' to 32 a's, 'b' to 33 b's, etc.
    ht_out[string(1, i)] = string(i, i);
  }
  ht_out.erase("c");  // just to test having some erased keys when we write.
  ht_out.erase("y");

  auto fp = tmpfile();
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_out.write_metadata(fp));
  for (sparse_hash_map<string, string, Hasher, Hasher>::const_iterator it =
           ht_out.begin();
       it != ht_out.end(); ++it) {
    const string::size_type first_size = it->first.length();
    fwrite(&first_size, sizeof(first_size), 1, fp);  // ignore endianness issues
    fwrite(it->first.c_str(), first_size, 1, fp);

    const string::size_type second_size = it->second.length();
    fwrite(&second_size, sizeof(second_size), 1, fp);
    fwrite(it->second.c_str(), second_size, 1, fp);
  }
  rewind(fp);

  sparse_hash_map<string, string, Hasher, Hasher> ht_in;
  EXPECT_TRUE(fp != NULL);
  EXPECT_TRUE(ht_in.read_metadata(fp));
  for (sparse_hash_map<string, string, Hasher, Hasher>::iterator it =
           ht_in.begin();
       it != ht_in.end(); ++it) {
    string::size_type first_size;
    EXPECT_EQ(1u, fread(&first_size, sizeof(first_size), 1, fp));
    char* first = new char[first_size];
    EXPECT_EQ(1u, fread(first, first_size, 1, fp));

    string::size_type second_size;
    EXPECT_EQ(1u, fread(&second_size, sizeof(second_size), 1, fp));
    char* second = new char[second_size];
    EXPECT_EQ(1u, fread(second, second_size, 1, fp));

    // it points to garbage, so we have to use placement-new to initialize.
    // We also have to use const-cast since it->first is const.
    new (const_cast<string*>(&it->first)) string(first, first_size);
    new (&it->second) string(second, second_size);
    delete[] first;
    delete[] second;
  }
  fclose(fp);

  EXPECT_EQ(string("                                "), ht_in[" "]);
  EXPECT_EQ(string("+++++++++++++++++++++++++++++++++++++++++++"), ht_in["+"]);
  EXPECT_EQ(string(""), ht_in["c"]);  // should not have been saved
  EXPECT_EQ(string(""), ht_in["y"]);
}